

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeH1.cpp
# Opt level: O0

void TPZShapeH1<pzshape::TPZShapeCube>::Shape(TPZVec<double> *pt,TPZShapeData *data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int64_t iVar4;
  double *pdVar5;
  TPZFMatrix<double> *pTVar6;
  long in_RSI;
  int xj_1;
  int i_1;
  int xj;
  int i;
  TPZFMatrix<double> *mult;
  TPZFNMatrix<1,_double> auxmat;
  int opt;
  REAL beta;
  REAL alpha;
  TPZManVector<double,_3> outvec;
  TPZFNMatrix<100,_double> dphiaux2;
  TPZFNMatrix<100,_double> dphiaux;
  TPZFNMatrix<100,_double> dphin;
  TPZFNMatrix<100,_double> phin;
  int sidedim;
  TPZTransform<double> *transform;
  int d_1;
  int numshape;
  int side;
  int shape;
  int d;
  int nod;
  TPZFNMatrix<81,_double> dphiblend;
  TPZFNMatrix<81,_double> phiblend;
  int NCorners;
  int NSides;
  int dim;
  _func_int **in_stack_ffffffffffffe7f8;
  TPZFMatrix<double> *in_stack_ffffffffffffe800;
  TPZFMatrix<double> *in_stack_ffffffffffffe808;
  double *in_stack_ffffffffffffe810;
  TPZVec<double> *in_stack_ffffffffffffe818;
  TPZFNMatrix<100,_double> *in_stack_ffffffffffffe820;
  TPZVec<double> *in_stack_ffffffffffffe828;
  TPZTransform<double> *in_stack_ffffffffffffe830;
  double *in_stack_ffffffffffffe838;
  TPZFNMatrix<1,_double> *in_stack_ffffffffffffe840;
  TPZFMatrix<double> *in_stack_ffffffffffffe950;
  TPZFMatrix<double> *in_stack_ffffffffffffe958;
  double dVar7;
  TPZVec<double> *in_stack_ffffffffffffe960;
  int local_1688;
  int local_1684;
  int local_1680;
  int local_167c;
  undefined1 local_1668 [164];
  undefined4 local_15c4;
  undefined8 local_15c0;
  undefined8 local_15b8;
  TPZFMatrix<double> *in_stack_ffffffffffffea90;
  TPZFMatrix<double> *in_stack_ffffffffffffea98;
  TPZVec<double> *in_stack_ffffffffffffeaa0;
  undefined1 local_11c0 [952];
  undefined1 local_e08 [1908];
  int local_694;
  TPZTransform<double> *local_690;
  int local_684;
  int local_680;
  int local_67c;
  int local_678;
  int local_674;
  int local_670;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  long local_10;
  
  local_10 = in_RSI;
  pzshape::TPZShapeCube::ShapeCorner
            (in_stack_ffffffffffffe960,in_stack_ffffffffffffe958,in_stack_ffffffffffffe950);
  iVar4 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(local_10 + 0x22a0));
  if (iVar4 != 8) {
    local_14 = 3;
    local_18 = 0x1b;
    local_1c = 8;
    TPZFNMatrix<81,_double>::TPZFNMatrix
              ((TPZFNMatrix<81,_double> *)in_stack_ffffffffffffe820,
               (int64_t)in_stack_ffffffffffffe818,(int64_t)in_stack_ffffffffffffe810);
    TPZFNMatrix<81,_double>::TPZFNMatrix
              ((TPZFNMatrix<81,_double> *)in_stack_ffffffffffffe820,
               (int64_t)in_stack_ffffffffffffe818,(int64_t)in_stack_ffffffffffffe810);
    for (local_670 = 0; local_670 < 8; local_670 = local_670 + 1) {
      pdVar5 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffe818,(int64_t)in_stack_ffffffffffffe810);
      dVar7 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffe818,(int64_t)in_stack_ffffffffffffe810);
      *pdVar5 = dVar7;
      for (local_674 = 0; local_674 < 3; local_674 = local_674 + 1) {
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe818,(int64_t)in_stack_ffffffffffffe810);
        dVar7 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe818,(int64_t)in_stack_ffffffffffffe810);
        *pdVar5 = dVar7;
      }
    }
    pzshape::TPZShapeCube::ShapeGenerating
              (in_stack_ffffffffffffeaa0,in_stack_ffffffffffffea98,in_stack_ffffffffffffea90);
    local_678 = 8;
    for (local_67c = 8; local_67c < 0x1b; local_67c = local_67c + 1) {
      TPZVec<int>::operator[]((TPZVec<int> *)(local_10 + 0x70),(long)(local_67c + -8));
      local_680 = pzshape::TPZShapeCube::NConnectShapeF
                            ((int)in_stack_ffffffffffffe800,
                             (int)((ulong)in_stack_ffffffffffffe7f8 >> 0x20));
      if (local_680 != 0) {
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe818,(int64_t)in_stack_ffffffffffffe810);
        dVar7 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe818,(int64_t)in_stack_ffffffffffffe810);
        *pdVar5 = dVar7;
        for (local_684 = 0; local_684 < 3; local_684 = local_684 + 1) {
          pdVar5 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe818,(int64_t)in_stack_ffffffffffffe810)
          ;
          dVar7 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe818,(int64_t)in_stack_ffffffffffffe810)
          ;
          *pdVar5 = dVar7;
        }
        local_678 = local_678 + 1;
        if (local_680 != 1) {
          local_690 = TPZVec<TPZTransform<double>_>::operator[]
                                ((TPZVec<TPZTransform<double>_> *)(local_10 + 400),
                                 (long)(local_67c + -8));
          local_694 = pztopology::TPZCube::SideDimension(0x18a152f);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffe820,(int64_t)in_stack_ffffffffffffe818,
                     (int64_t)in_stack_ffffffffffffe810);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffe820,(int64_t)in_stack_ffffffffffffe818,
                     (int64_t)in_stack_ffffffffffffe810);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffe820,(int64_t)in_stack_ffffffffffffe818,
                     (int64_t)in_stack_ffffffffffffe810);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffe820,(int64_t)in_stack_ffffffffffffe818,
                     (int64_t)in_stack_ffffffffffffe810);
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffe820,
                     (int64_t)in_stack_ffffffffffffe818);
          TPZTransform<double>::Apply
                    (in_stack_ffffffffffffe830,in_stack_ffffffffffffe828,
                     (TPZVec<double> *)in_stack_ffffffffffffe820);
          TPZVec<int>::operator[]((TPZVec<int> *)(local_10 + 0x70),(long)(local_67c + -8));
          pzshape::TPZShapeCube::ShapeInternal
                    ((int)((ulong)in_stack_ffffffffffffe820 >> 0x20),in_stack_ffffffffffffe818,
                     (int)((ulong)in_stack_ffffffffffffe810 >> 0x20),in_stack_ffffffffffffe808,
                     in_stack_ffffffffffffe800);
          if (local_694 < 3) {
            local_15b8 = 0x3ff0000000000000;
            local_15c0 = 0;
            local_15c4 = 1;
            TPZFNMatrix<1,_double>::TPZFNMatrix
                      (in_stack_ffffffffffffe840,(int64_t)in_stack_ffffffffffffe838,
                       (int64_t)in_stack_ffffffffffffe830,(double *)in_stack_ffffffffffffe828);
            pTVar6 = TPZTransform<double>::Mult(local_690);
            (*(pTVar6->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x27])(0x3ff0000000000000,0,pTVar6,local_e08,local_1668,local_11c0,1)
            ;
            for (local_167c = 1; local_167c < local_680; local_167c = local_167c + 1) {
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe818,
                                  (int64_t)in_stack_ffffffffffffe810);
              dVar7 = *pdVar5;
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe818,
                                  (int64_t)in_stack_ffffffffffffe810);
              dVar1 = *pdVar5;
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe818,
                                  (int64_t)in_stack_ffffffffffffe810);
              *pdVar5 = dVar7 * dVar1;
              for (local_1680 = 0; local_1680 < 3; local_1680 = local_1680 + 1) {
                pdVar5 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffe818,
                                    (int64_t)in_stack_ffffffffffffe810);
                dVar7 = *pdVar5;
                pdVar5 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffe818,
                                    (int64_t)in_stack_ffffffffffffe810);
                dVar1 = *pdVar5;
                pdVar5 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffe818,
                                    (int64_t)in_stack_ffffffffffffe810);
                dVar2 = *pdVar5;
                pdVar5 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffe818,
                                    (int64_t)in_stack_ffffffffffffe810);
                dVar3 = *pdVar5;
                pdVar5 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffe818,
                                    (int64_t)in_stack_ffffffffffffe810);
                *pdVar5 = dVar7 * dVar1 + dVar2 * dVar3;
              }
              local_678 = local_678 + 1;
            }
            TPZFNMatrix<1,_double>::~TPZFNMatrix((TPZFNMatrix<1,_double> *)0x18a1a41);
          }
          else {
            for (local_1684 = 1; local_1684 < local_680; local_1684 = local_1684 + 1) {
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe818,
                                  (int64_t)in_stack_ffffffffffffe810);
              dVar7 = *pdVar5;
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe818,
                                  (int64_t)in_stack_ffffffffffffe810);
              in_stack_ffffffffffffe840 = (TPZFNMatrix<1,_double> *)(dVar7 * *pdVar5);
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe818,
                                  (int64_t)in_stack_ffffffffffffe810);
              *pdVar5 = (double)in_stack_ffffffffffffe840;
              for (local_1688 = 0; local_1688 < 3; local_1688 = local_1688 + 1) {
                in_stack_ffffffffffffe838 =
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe818,
                                (int64_t)in_stack_ffffffffffffe810);
                in_stack_ffffffffffffe828 = (TPZVec<double> *)*in_stack_ffffffffffffe838;
                in_stack_ffffffffffffe830 =
                     (TPZTransform<double> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe818,
                                (int64_t)in_stack_ffffffffffffe810);
                in_stack_ffffffffffffe818 =
                     (TPZVec<double> *)
                     (in_stack_ffffffffffffe830->super_TPZSavable)._vptr_TPZSavable;
                in_stack_ffffffffffffe820 =
                     (TPZFNMatrix<100,_double> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe818,
                                (int64_t)in_stack_ffffffffffffe810);
                in_stack_ffffffffffffe808 =
                     (TPZFMatrix<double> *)
                     (in_stack_ffffffffffffe820->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                     super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
                in_stack_ffffffffffffe810 =
                     TPZFMatrix<double>::operator()
                               ((TPZFMatrix<double> *)in_stack_ffffffffffffe820,
                                (int64_t)in_stack_ffffffffffffe818,
                                (int64_t)in_stack_ffffffffffffe810);
                in_stack_ffffffffffffe7f8 =
                     (_func_int **)
                     ((double)in_stack_ffffffffffffe828 * (double)in_stack_ffffffffffffe818 +
                     (double)in_stack_ffffffffffffe808 * *in_stack_ffffffffffffe810);
                in_stack_ffffffffffffe800 =
                     (TPZFMatrix<double> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe820->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe818,
                                (int64_t)in_stack_ffffffffffffe810);
                (in_stack_ffffffffffffe800->super_TPZMatrix<double>).super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable = in_stack_ffffffffffffe7f8;
              }
              local_678 = local_678 + 1;
            }
          }
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffe800);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18a1c93);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18a1ca0);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18a1cad);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18a1cba);
        }
      }
    }
    TPZFNMatrix<81,_double>::~TPZFNMatrix((TPZFNMatrix<81,_double> *)0x18a1d20);
    TPZFNMatrix<81,_double>::~TPZFNMatrix((TPZFNMatrix<81,_double> *)0x18a1d2d);
  }
  return;
}

Assistant:

void TPZShapeH1<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data) {

    
//    TPZVec<REAL> &pt = par.pt;
//    TPZFMatrix<REAL> &phi = par.phi;
//    TPZFMatrix<REAL> &dphi = par.dphi;
    
    TSHAPE::ShapeCorner(pt,data.fPhi,data.fDPhi);
    
    if(data.fPhi.Rows() == TSHAPE::NCornerNodes) return;
    
    const int dim = TSHAPE::Dimension;
    const int NSides = TSHAPE::NSides;
    const int NCorners = TSHAPE::NCornerNodes;

    TPZFNMatrix<NSides*dim,REAL> phiblend(NSides,1),dphiblend(dim,NSides);
    for(int nod=0; nod<NCorners; nod++)
    {
        phiblend(nod,0) = data.fPhi(nod,0);
        for(int d=0; d< dim; d++)
        {
            dphiblend(d,nod) = data.fDPhi(d,nod);
        }
    }
    TSHAPE::ShapeGenerating(pt, phiblend, dphiblend);
    int shape = NCorners;
    for (int side = NCorners; side<NSides ; side++)
    {
        int numshape = TSHAPE::NConnectShapeF(side, data.fH1ConnectOrders[side-NCorners]);
        if(numshape == 0) continue;
        
        data.fPhi(shape,0) = phiblend(side,0);
        for(int d=0; d<dim; d++) data.fDPhi(d,shape) = dphiblend(d,side);
        shape++;
        
        if(numshape == 1) continue;
        
        TPZTransform<REAL> &transform = data.fSideTransforms[side - NCorners];
        int sidedim = TSHAPE::SideDimension(side);
        TPZFNMatrix<100,REAL> phin(numshape,1), dphin(sidedim,numshape), dphiaux(TSHAPE::Dimension,numshape),
            dphiaux2(TSHAPE::Dimension,numshape);
        TPZManVector<REAL,3> outvec(sidedim);
        transform.Apply(pt, outvec);
//        dphin.Zero();
        TSHAPE::ShapeInternal(side, outvec,data.fH1ConnectOrders[side - NCorners], phin, dphin);
        if(sidedim < 3)
        {
            constexpr REAL alpha = 1.;
            constexpr REAL beta = 0.;
            constexpr int opt = 1;
            TPZFNMatrix<1,REAL> auxmat(1,1,0);    
            TPZFMatrix<REAL> &mult = transform.Mult();
            mult.MultAdd(dphin, auxmat, dphiaux,alpha,beta,opt);
            
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphiaux(xj,i);
                }
                shape++;
            }
        } else
        {
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphin(xj,i);
                }
                shape++;
            }

        }
    }
    
}